

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

bool __thiscall dgPolyhedra::FlipEdge(dgPolyhedra *this,dgEdge *edge)

{
  dgEdge *pdVar1;
  dgEdge *pdVar2;
  dgEdge *pdVar3;
  dgTreeNode *pdVar4;
  dgTreeNode *node;
  long lVar5;
  ulong key;
  
  if ((edge->m_next->m_next->m_next == edge) &&
     (pdVar1 = edge->m_twin, pdVar1->m_next->m_next->m_next == pdVar1)) {
    pdVar2 = edge->m_prev;
    pdVar1 = pdVar1->m_prev;
    key = (long)pdVar2->m_incidentVertex << 0x20 | (long)pdVar1->m_incidentVertex;
    pdVar4 = (this->super_dgTree<dgEdge,_long>).m_head;
    while( true ) {
      if (pdVar4 == (dgTreeNode *)0x0) {
        if ((edge[-1].m_mark & 2) != 0) {
          dgTree<dgEdge,_long>::ReplaceKey
                    (&this->super_dgTree<dgEdge,_long>,(dgTreeNode *)&edge[-1].m_userData,
                     (long)pdVar1->m_incidentVertex << 0x20 | (long)pdVar2->m_incidentVertex);
          if ((edge->m_twin[-1].m_mark & 2) != 0) {
            dgTree<dgEdge,_long>::ReplaceKey
                      (&this->super_dgTree<dgEdge,_long>,(dgTreeNode *)&edge->m_twin[-1].m_userData,
                       key);
            edge->m_incidentVertex = pdVar1->m_incidentVertex;
            pdVar3 = edge->m_twin;
            pdVar3->m_incidentVertex = pdVar2->m_incidentVertex;
            edge->m_userData = pdVar1->m_userData;
            pdVar3->m_userData = pdVar2->m_userData;
            pdVar2->m_next = pdVar3->m_next;
            pdVar1->m_prev->m_prev = edge->m_prev;
            pdVar1->m_next = edge->m_next;
            pdVar2->m_prev->m_prev = pdVar3->m_prev;
            edge->m_prev = pdVar1->m_prev;
            edge->m_next = pdVar2;
            pdVar3->m_prev = pdVar2->m_prev;
            pdVar3->m_next = pdVar1;
            pdVar1->m_prev->m_next = edge;
            pdVar1->m_prev = pdVar3;
            pdVar2->m_prev->m_next = pdVar3;
            pdVar2->m_prev = edge;
            edge->m_next->m_incidentFace = edge->m_incidentFace;
            edge->m_prev->m_incidentFace = edge->m_incidentFace;
            pdVar3->m_next->m_incidentFace = pdVar3->m_incidentFace;
            pdVar3->m_prev->m_incidentFace = pdVar3->m_incidentFace;
            return true;
          }
        }
        __assert_fail("retnode->IsInTree ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTree.h"
                      ,0x193,
                      "typename dgTree<OBJECT, KEY>::dgTreeNode *dgTree<dgEdge, long>::GetNodeFromInfo(OBJECT &) const [OBJECT = dgEdge, KEY = long]"
                     );
      }
      lVar5 = 8;
      if ((pdVar4->m_key <= (long)key) && (lVar5 = 0x10, (long)key <= pdVar4->m_key)) break;
      pdVar4 = *(dgTreeNode **)((long)&(pdVar4->super_dgRedBackNode)._vptr_dgRedBackNode + lVar5);
    }
  }
  return false;
}

Assistant:

bool dgPolyhedra::FlipEdge (dgEdge* const edge)
{
	//	dgTreeNode *node;
	if (edge->m_next->m_next->m_next != edge) {
		return false;
	}

	if (edge->m_twin->m_next->m_next->m_next != edge->m_twin) {
		return false;
	}

	if (FindEdge(edge->m_prev->m_incidentVertex, edge->m_twin->m_prev->m_incidentVertex)) {
		return false;
	}

	dgEdge *const prevEdge = edge->m_prev;
	dgEdge *const prevTwin = edge->m_twin->m_prev;

	dgPairKey edgeKey (prevTwin->m_incidentVertex, prevEdge->m_incidentVertex);
	dgPairKey twinKey (prevEdge->m_incidentVertex, prevTwin->m_incidentVertex);

	ReplaceKey (GetNodeFromInfo (*edge), edgeKey.GetVal());
	//	HACD_ASSERT (node);

	ReplaceKey (GetNodeFromInfo (*edge->m_twin), twinKey.GetVal());
	//	HACD_ASSERT (node);

	edge->m_incidentVertex = prevTwin->m_incidentVertex;
	edge->m_twin->m_incidentVertex = prevEdge->m_incidentVertex;

	edge->m_userData = prevTwin->m_userData;
	edge->m_twin->m_userData = prevEdge->m_userData;

	prevEdge->m_next = edge->m_twin->m_next;
	prevTwin->m_prev->m_prev = edge->m_prev;

	prevTwin->m_next = edge->m_next;
	prevEdge->m_prev->m_prev = edge->m_twin->m_prev;

	edge->m_prev = prevTwin->m_prev;
	edge->m_next = prevEdge;

	edge->m_twin->m_prev = prevEdge->m_prev;
	edge->m_twin->m_next = prevTwin;

	prevTwin->m_prev->m_next = edge;
	prevTwin->m_prev = edge->m_twin;

	prevEdge->m_prev->m_next = edge->m_twin;
	prevEdge->m_prev = edge;

	edge->m_next->m_incidentFace = edge->m_incidentFace;
	edge->m_prev->m_incidentFace = edge->m_incidentFace;

	edge->m_twin->m_next->m_incidentFace = edge->m_twin->m_incidentFace;
	edge->m_twin->m_prev->m_incidentFace = edge->m_twin->m_incidentFace;


#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck ());
#endif

	return true;
}